

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O2

bool __thiscall ApprovalTests::SystemLauncher::launch(SystemLauncher *this,string *commandLine)

{
  string launch;
  string local_30;
  
  (*(this->super_CommandLauncher)._vptr_CommandLauncher[3])(&local_30,this,commandLine);
  SystemUtils::runSystemCommandOrThrow(&local_30,this->allowNonZeroExitCodes_);
  ::std::__cxx11::string::~string((string *)&local_30);
  return true;
}

Assistant:

bool SystemLauncher::launch(const std::string& commandLine)
    {
        std::string launch = getCommandLine(commandLine);

        SystemUtils::runSystemCommandOrThrow(launch, allowNonZeroExitCodes_);
        return true;
    }